

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O0

S1Angle S2::GetLength(S2ShapeIndex *index)

{
  int iVar1;
  undefined4 extraout_var;
  S1Angle a;
  S2Shape *shape;
  int i;
  S2ShapeIndex *index_local;
  S1Angle length;
  
  S1Angle::S1Angle((S1Angle *)&index_local);
  shape._4_4_ = 0;
  while( true ) {
    iVar1 = (*index->_vptr_S2ShapeIndex[2])();
    if (iVar1 <= (int)shape._4_4_) break;
    iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)shape._4_4_);
    if ((S2Shape *)CONCAT44(extraout_var,iVar1) != (S2Shape *)0x0) {
      a = GetLength((S2Shape *)CONCAT44(extraout_var,iVar1));
      S1Angle::operator+=((S1Angle *)&index_local,a);
    }
    shape._4_4_ = shape._4_4_ + 1;
  }
  return (S1Angle)(double)index_local;
}

Assistant:

S1Angle GetLength(const S2ShapeIndex& index) {
  S1Angle length;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape) length += S2::GetLength(*shape);
  }
  return length;
}